

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

bool __thiscall FStateDefinitions::SetLoop(FStateDefinitions *this)

{
  FState *pFVar1;
  
  pFVar1 = this->laststate;
  if (pFVar1 != (FState *)0x0) {
    pFVar1->DefineFlags = '\x05';
    pFVar1->NextState = (FState *)(this->lastlabel + 1);
    this->laststatebeforelabel = (FState *)0x0;
  }
  return pFVar1 != (FState *)0x0;
}

Assistant:

bool FStateDefinitions::SetLoop()
{
	if (laststate != NULL)
	{
		laststate->DefineFlags = SDF_INDEX;
		laststate->NextState = (FState*)(lastlabel+1);
		laststatebeforelabel = NULL;
		return true;
	}
	return false;
}